

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

HandlePtr __thiscall
dg::vr::ValueRelations::getAndMerge(ValueRelations *this,ValueRelations *other,Handle otherH)

{
  bool bVar1;
  ValueRelations *in_RDI;
  Handle unaff_retaddr;
  V in_stack_00000008;
  ValueRelations *in_stack_00000010;
  V val;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  size_t borderId;
  HandlePtr thisH;
  VectorSet<const_llvm::Value_*> *otherEqual;
  Handle in_stack_ffffffffffffff88;
  Bucket *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_48;
  VectorSet<const_llvm::Value_*> *local_40;
  size_t local_38;
  HandlePtr local_30;
  VectorSet<const_llvm::Value_*> *local_28;
  HandlePtr local_8;
  
  local_28 = getEqual((ValueRelations *)
                      CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  local_30 = getCorresponding((ValueRelations *)__range2,(ValueRelations *)__begin2._M_current,
                              (Handle)__end2._M_current,(VectorSet<const_llvm::Value_*> *)val);
  if (local_30 == (HandlePtr)0x0) {
    local_8 = (HandlePtr)0x0;
  }
  else {
    local_38 = getBorderId(in_RDI,in_stack_ffffffffffffff88);
    if (local_38 != 0xffffffffffffffff) {
      RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket
                ((RelationsGraph<dg::vr::ValueRelations> *)
                 CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(size_t)in_RDI);
    }
    local_40 = local_28;
    local_48._M_current =
         (Value **)
         VectorSet<const_llvm::Value_*>::begin
                   ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff88);
    VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff88)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator*(&local_48);
      add(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_48);
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getAndMerge(const ValueRelations &other, Handle otherH) {
    const VectorSet<V> &otherEqual = other.getEqual(otherH);
    HandlePtr thisH = getCorresponding(other, otherH, otherEqual);

    if (!thisH)
        return nullptr;

    size_t borderId = other.getBorderId(otherH);
    if (borderId != std::string::npos)
        graph.makeBorderBucket(*thisH, borderId);

    for (V val : otherEqual)
        add(val, *thisH);

    return thisH;
}